

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intraprocess_subscriber_link.cpp
# Opt level: O1

void __thiscall
miniros::IntraProcessSubscriberLink::setSubscriber
          (IntraProcessSubscriberLink *this,IntraProcessPublisherLinkPtr *subscriber)

{
  uint32_t uVar1;
  ConnectionManagerPtr *pCVar2;
  
  (this->subscriber_).
  super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (subscriber->
       super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->subscriber_).
              super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(subscriber->
              super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  pCVar2 = ConnectionManager::instance();
  uVar1 = ConnectionManager::getNewConnectionID
                    ((pCVar2->
                     super___shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
  (this->super_SubscriberLink).connection_id_ = uVar1;
  this_node::getName_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&(this->super_SubscriberLink).destination_caller_id_);
  return;
}

Assistant:

void IntraProcessSubscriberLink::setSubscriber(const IntraProcessPublisherLinkPtr& subscriber)
{
  subscriber_ = subscriber;
  connection_id_ = ConnectionManager::instance()->getNewConnectionID();
  destination_caller_id_ = this_node::getName();
}